

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O3

void __thiscall RegVmLoweredFunction::FreeConstantRegisters(RegVmLoweredFunction *this)

{
  ulong uVar1;
  
  if ((this->constantRegisters).count != 0) {
    uVar1 = 0;
    do {
      FreeRegister(this,(this->constantRegisters).data[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (this->constantRegisters).count);
  }
  (this->constantRegisters).count = 0;
  return;
}

Assistant:

void RegVmLoweredFunction::FreeConstantRegisters()
{
	for(unsigned i = 0; i < constantRegisters.size(); i++)
		FreeRegister(constantRegisters[i]);

	constantRegisters.clear();
}